

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O3

void __thiscall
qclab::qgates::QGate2<double>::apply
          (QGate2<double> *this,Op op,int nbQubits,vector<double,_std::allocator<double>_> *vector,
          int offset)

{
  vector<int,_std::allocator<int>_> qubits;
  anon_class_136_17_7d744f41 f;
  SquareMatrix<double> local_e0;
  int *local_d0 [2];
  long local_c0;
  anon_class_136_17_7d744f41 local_b8;
  
  (*(this->super_QObject<double>)._vptr_QObject[5])(local_d0,this);
  *(ulong *)local_d0[0] =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)local_d0[0] >> 0x20),
                offset + (int)*(undefined8 *)local_d0[0]);
  (*(this->super_QObject<double>)._vptr_QObject[7])(&local_e0,this);
  lambda_QGate2<double>
            (&local_b8,op,&local_e0,
             (vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start);
  if ((_Head_base<0UL,_double_*,_false>)
      local_e0.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_double_*,_false>)0x0)
  {
    operator_delete__((void *)local_e0.data_._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  local_e0.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  apply4<qclab::qgates::lambda_QGate2<double>(qclab::Op,qclab::dense::SquareMatrix<double>,double*)::_lambda(unsigned_long,unsigned_long,unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_d0[0],local_d0[0][1],&local_b8);
  if (local_d0[0] != (int *)0x0) {
    operator_delete(local_d0[0],local_c0 - (long)local_d0[0]);
  }
  return;
}

Assistant:

void QGate2< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_QGate2( op , this->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , f ) ;
  }